

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::GetInterpolationOrder
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZVec<int> *ord)

{
  int iVar1;
  int *piVar2;
  TPZVec<int> *in_RSI;
  long *in_RDI;
  int i;
  int local_14;
  
  iVar1 = (**(code **)(*in_RDI + 0x90))();
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,(long)iVar1);
  local_14 = 0;
  while( true ) {
    iVar1 = (**(code **)(*in_RDI + 0x90))();
    if (iVar1 <= local_14) break;
    iVar1 = (**(code **)(*in_RDI + 0x3c0))(in_RDI,local_14);
    piVar2 = TPZVec<int>::operator[](in_RSI,(long)local_14);
    *piVar2 = iVar1;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::GetInterpolationOrder(TPZVec<int> &ord) {
	ord.Resize(NConnects());
	int i;
	for(i=0; i<NConnects(); i++) {
		ord[i] = ConnectOrder(i);
	}
}